

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O3

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,float *__a,float *__b,float *__c)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  
  fVar1 = *__b;
  fVar7 = (float)(int)__a[2];
  fVar6 = *__a / fVar7;
  if (fVar1 / fVar7 <= fVar6) {
    if (*__c / fVar7 <= fVar6) {
      if (fVar1 / (float)(int)__b[2] < *__c / (float)(int)__b[2]) goto LAB_00524d4f;
      goto LAB_00524d86;
    }
  }
  else {
    if (fVar1 / (float)(int)__b[2] < *__c / (float)(int)__b[2]) {
LAB_00524d86:
      uVar2 = __result[2];
      uVar3 = *__result;
      uVar4 = __result[1];
      __result[2] = *(undefined8 *)(__b + 4);
      uVar5 = *(undefined8 *)(__b + 2);
      *__result = *(undefined8 *)__b;
      __result[1] = uVar5;
      *(undefined8 *)(__b + 4) = uVar2;
      *(undefined8 *)__b = uVar3;
      *(undefined8 *)(__b + 2) = uVar4;
      return;
    }
    if (fVar6 < *__c / fVar7) {
LAB_00524d4f:
      uVar2 = __result[2];
      uVar3 = *__result;
      uVar4 = __result[1];
      __result[2] = *(undefined8 *)(__c + 4);
      uVar5 = *(undefined8 *)(__c + 2);
      *__result = *(undefined8 *)__c;
      __result[1] = uVar5;
      *(undefined8 *)(__c + 4) = uVar2;
      *(undefined8 *)__c = uVar3;
      *(undefined8 *)(__c + 2) = uVar4;
      return;
    }
  }
  uVar2 = __result[2];
  uVar3 = *__result;
  uVar4 = __result[1];
  __result[2] = *(undefined8 *)(__a + 4);
  uVar5 = *(undefined8 *)(__a + 2);
  *__result = *(undefined8 *)__a;
  __result[1] = uVar5;
  *(undefined8 *)(__a + 4) = uVar2;
  *(undefined8 *)__a = uVar3;
  *(undefined8 *)(__a + 2) = uVar4;
  return;
}

Assistant:

constexpr bool operator<(const item& other) const noexcept
        {
            if constexpr (std::is_same_v<Mode, minimize_tag>)
                return (r / static_cast<Float>(factor)) <
                       (other.r / static_cast<Float>(factor));
            else
                return (other.r / static_cast<Float>(factor)) <
                       (r / static_cast<Float>(factor));
        }